

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::CalcCoordDerivMatrix
          (ChElementShellANCF_3833 *this,Matrix3xN *ebardot)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_70;
  BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true> local_60;
  
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((((this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,6);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,7);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,8);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,9);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,10);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0xb);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0xc);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0xd);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0xe);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0xf);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x10);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x11);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x12);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x13);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[6].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x14);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x15);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x16);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[7].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_60,ebardot,0x17);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,24,1,3,24>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_3,_1,_false> *)&local_60,&local_70);
  return;
}

Assistant:

void ChElementShellANCF_3833::CalcCoordDerivMatrix(Matrix3xN& ebardot) {
    ebardot.col(0) = m_nodes[0]->GetPos_dt().eigen();
    ebardot.col(1) = m_nodes[0]->GetD_dt().eigen();
    ebardot.col(2) = m_nodes[0]->GetDD_dt().eigen();

    ebardot.col(3) = m_nodes[1]->GetPos_dt().eigen();
    ebardot.col(4) = m_nodes[1]->GetD_dt().eigen();
    ebardot.col(5) = m_nodes[1]->GetDD_dt().eigen();

    ebardot.col(6) = m_nodes[2]->GetPos_dt().eigen();
    ebardot.col(7) = m_nodes[2]->GetD_dt().eigen();
    ebardot.col(8) = m_nodes[2]->GetDD_dt().eigen();

    ebardot.col(9) = m_nodes[3]->GetPos_dt().eigen();
    ebardot.col(10) = m_nodes[3]->GetD_dt().eigen();
    ebardot.col(11) = m_nodes[3]->GetDD_dt().eigen();

    ebardot.col(12) = m_nodes[4]->GetPos_dt().eigen();
    ebardot.col(13) = m_nodes[4]->GetD_dt().eigen();
    ebardot.col(14) = m_nodes[4]->GetDD_dt().eigen();

    ebardot.col(15) = m_nodes[5]->GetPos_dt().eigen();
    ebardot.col(16) = m_nodes[5]->GetD_dt().eigen();
    ebardot.col(17) = m_nodes[5]->GetDD_dt().eigen();

    ebardot.col(18) = m_nodes[6]->GetPos_dt().eigen();
    ebardot.col(19) = m_nodes[6]->GetD_dt().eigen();
    ebardot.col(20) = m_nodes[6]->GetDD_dt().eigen();

    ebardot.col(21) = m_nodes[7]->GetPos_dt().eigen();
    ebardot.col(22) = m_nodes[7]->GetD_dt().eigen();
    ebardot.col(23) = m_nodes[7]->GetDD_dt().eigen();
}